

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeVector.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMNodeVector::insertElementAt(DOMNodeVector *this,DOMNode *elem,XMLSize_t index)

{
  ulong local_28;
  XMLSize_t i;
  XMLSize_t index_local;
  DOMNode *elem_local;
  DOMNodeVector *this_local;
  
  if (index <= this->nextFreeSlot) {
    checkSpace(this);
    for (local_28 = this->nextFreeSlot; index < local_28; local_28 = local_28 - 1) {
      this->data[local_28] = this->data[local_28 - 1];
    }
    this->data[index] = elem;
    this->nextFreeSlot = this->nextFreeSlot + 1;
    return;
  }
  __assert_fail("index <= nextFreeSlot",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeVector.cpp"
                ,0x5d,"void xercesc_4_0::DOMNodeVector::insertElementAt(DOMNode *, XMLSize_t)");
}

Assistant:

void DOMNodeVector::insertElementAt(DOMNode *elem, XMLSize_t index) {

	assert(index <= nextFreeSlot);

	checkSpace();
	for (XMLSize_t i=nextFreeSlot; i>index; --i) {
		data[i] = data[i-1];
	}
	data[index] = elem;
	++nextFreeSlot;

}